

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod.c
# Opt level: O0

int acmod_write_scores(acmod_t *acmod,int n_active,uint8 *active,int16 *senscr,FILE *senfh)

{
  size_t sVar1;
  int local_44;
  int local_40;
  int n;
  int i;
  int16 n_active2;
  FILE *senfh_local;
  int16 *senscr_local;
  uint8 *active_local;
  acmod_t *paStack_18;
  int n_active_local;
  acmod_t *acmod_local;
  
  n._2_2_ = (undefined2)n_active;
  _i = (FILE *)senfh;
  senfh_local = (FILE *)senscr;
  senscr_local = (int16 *)active;
  active_local._4_4_ = n_active;
  paStack_18 = acmod;
  sVar1 = fwrite((void *)((long)&n + 2),2,1,(FILE *)senfh);
  if (sVar1 == 1) {
    if (active_local._4_4_ == paStack_18->mdef->n_sen) {
      sVar1 = fwrite(senfh_local,2,(long)active_local._4_4_,_i);
      if (sVar1 == (long)active_local._4_4_) {
        return 0;
      }
    }
    else {
      sVar1 = fwrite(senscr_local,1,(long)active_local._4_4_,_i);
      if (sVar1 == (long)active_local._4_4_) {
        local_44 = 0;
        local_40 = 0;
        while( true ) {
          if (active_local._4_4_ <= local_40) {
            return 0;
          }
          local_44 = (uint)*(byte *)((long)senscr_local + (long)local_40) + local_44;
          sVar1 = fwrite((void *)((long)&senfh_local->_flags + (long)local_44 * 2),2,1,_i);
          if (sVar1 != 1) break;
          local_40 = local_40 + 1;
        }
      }
    }
  }
  err_msg_system(ERR_ERROR,
                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/acmod.c"
                 ,0x393,"Failed to write frame to senone file");
  return -1;
}

Assistant:

int
acmod_write_scores(acmod_t *acmod, int n_active, uint8 const *active,
                   int16 const *senscr, FILE *senfh)
{
    int16 n_active2;

    /* Uncompressed frame format:
     *
     * (2 bytes) n_active: Number of active senones
     * If all senones active:
     * (n_active * 2 bytes) scores of active senones
     *
     * Otherwise:
     * (2 bytes) n_active: Number of active senones
     * (n_active bytes) deltas to active senones
     * (n_active * 2 bytes) scores of active senones
     */
    n_active2 = n_active;
    if (fwrite(&n_active2, 2, 1, senfh) != 1)
        goto error_out;
    if (n_active == bin_mdef_n_sen(acmod->mdef)) {
        if (fwrite(senscr, 2, n_active, senfh) != (size_t) n_active)
            goto error_out;
    }
    else {
        int i, n;
        if (fwrite(active, 1, n_active, senfh) != (size_t) n_active)
            goto error_out;
        for (i = n = 0; i < n_active; ++i) {
            n += active[i];
            if (fwrite(senscr + n, 2, 1, senfh) != 1)
                goto error_out;
        }
    }
    return 0;
error_out:
    E_ERROR_SYSTEM("Failed to write frame to senone file");
    return -1;
}